

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

void __thiscall
testing::internal::PairMatcherImpl<std::pair<unsigned_long_const,unsigned_long>const&>::
PairMatcherImpl<int,int>
          (PairMatcherImpl<std::pair<unsigned_long_const,unsigned_long>const&> *this,
          int first_matcher,int second_matcher)

{
  undefined4 extraout_EDX;
  undefined4 extraout_EDX_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int local_18;
  int local_14;
  int second_matcher_local;
  int first_matcher_local;
  PairMatcherImpl<const_std::pair<const_unsigned_long,_unsigned_long>_&> *this_local;
  
  local_18 = second_matcher;
  local_14 = first_matcher;
  _second_matcher_local = this;
  MatcherInterface<const_std::pair<const_unsigned_long,_unsigned_long>_&>::MatcherInterface
            ((MatcherInterface<const_std::pair<const_unsigned_long,_unsigned_long>_&> *)this);
  *(undefined ***)this = &PTR__PairMatcherImpl_00477680;
  SafeMatcherCast<unsigned_long_const&,int>
            ((Matcher<const_unsigned_long_&> *)(this + 8),(testing *)&local_14,
             (int *)CONCAT44(extraout_var,extraout_EDX));
  SafeMatcherCast<unsigned_long_const&,int>
            ((Matcher<const_unsigned_long_&> *)(this + 0x20),(testing *)&local_18,
             (int *)CONCAT44(extraout_var_00,extraout_EDX_00));
  return;
}

Assistant:

PairMatcherImpl(FirstMatcher first_matcher, SecondMatcher second_matcher)
      : first_matcher_(
            testing::SafeMatcherCast<const FirstType&>(first_matcher)),
        second_matcher_(
            testing::SafeMatcherCast<const SecondType&>(second_matcher)) {}